

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparcDisassembler.c
# Opt level: O0

_Bool Sparc_getInstruction
                (csh ud,uint8_t *code,size_t code_len,MCInst *MI,uint16_t *size,uint64_t address,
                void *info)

{
  DecodeStatus DVar1;
  uint32_t local_44;
  DecodeStatus Result;
  uint32_t Insn;
  uint64_t address_local;
  uint16_t *size_local;
  MCInst *MI_local;
  size_t code_len_local;
  uint8_t *code_local;
  csh ud_local;
  
  _Result = address;
  address_local = (uint64_t)size;
  size_local = (uint16_t *)MI;
  MI_local = (MCInst *)code_len;
  code_len_local = (size_t)code;
  code_local = (uint8_t *)ud;
  DVar1 = readInstruction32(code,code_len,&local_44);
  if (DVar1 == MCDisassembler_Fail) {
    ud_local._7_1_ = false;
  }
  else {
    if (*(long *)(*(long *)(size_local + 0x188) + 0xe8) != 0) {
      memset(*(void **)(*(long *)(size_local + 0x188) + 0xe8),0,0x5f8);
    }
    DVar1 = decodeInstruction_4(DecoderTableSparc32,(MCInst *)size_local,local_44,_Result,
                                (MCRegisterInfo *)info,0);
    if (DVar1 == MCDisassembler_Fail) {
      ud_local._7_1_ = false;
    }
    else {
      *(undefined2 *)address_local = 4;
      ud_local._7_1_ = DVar1 != MCDisassembler_Fail;
    }
  }
  return ud_local._7_1_;
}

Assistant:

bool Sparc_getInstruction(csh ud, const uint8_t *code, size_t code_len, MCInst *MI,
		uint16_t *size, uint64_t address, void *info)
{
	uint32_t Insn;
	DecodeStatus Result;
	
	Result = readInstruction32(code, code_len, &Insn);
	if (Result == MCDisassembler_Fail)
		return MCDisassembler_Fail;

	if (MI->flat_insn->detail) {
		memset(MI->flat_insn->detail, 0, sizeof(cs_detail));
	}

	Result = decodeInstruction_4(DecoderTableSparc32, MI, Insn, address,
			(MCRegisterInfo *)info, 0);
	if (Result != MCDisassembler_Fail) {
		*size = 4;
		return Result;
	}

	return MCDisassembler_Fail;
}